

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"wrap_func1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"wrap_func2");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"wrap_func1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"wrap_func1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"wrap_func2");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"wrap_func2");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

ALWAYS_INLINE static inline auto
    call(Func &&func, Args&&... args)
        -> decltype(func(std::forward<Args>(args)...))
    {
        std::cout << "wrap_func1" << std::endl;
        return func(std::forward<Args>(args)...);
    }